

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_integer_with_boolean_literal(void)

{
  undefined1 local_81a;
  bool local_819;
  basic_variable<std::allocator<char>_> local_818;
  undefined1 local_7dc [2];
  undefined1 local_7da;
  bool local_7d9;
  basic_variable<std::allocator<char>_> local_7d8;
  undefined1 local_79c [2];
  undefined1 local_79a;
  bool local_799;
  basic_variable<std::allocator<char>_> local_798;
  undefined1 local_75c [2];
  undefined1 local_75a;
  bool local_759;
  basic_variable<std::allocator<char>_> local_758;
  undefined1 local_71c [2];
  undefined1 local_71a;
  bool local_719;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6dc [2];
  undefined1 local_6da;
  bool local_6d9;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69c [2];
  undefined1 local_69a;
  bool local_699;
  basic_variable<std::allocator<char>_> local_698;
  undefined1 local_65c [2];
  undefined1 local_65a;
  bool local_659;
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_61c [2];
  undefined1 local_61a;
  bool local_619;
  basic_variable<std::allocator<char>_> local_618;
  undefined1 local_5dc [2];
  undefined1 local_5da;
  bool local_5d9;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_59c [2];
  undefined1 local_59a;
  bool local_599;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55c [2];
  undefined1 local_55a;
  bool local_559;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_51c [2];
  undefined1 local_51a;
  bool local_519;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4dc [2];
  undefined1 local_4da;
  bool local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_49c [2];
  undefined1 local_49a;
  bool local_499;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45c [2];
  undefined1 local_45a;
  bool local_459;
  basic_variable<std::allocator<char>_> local_458;
  undefined1 local_41c [2];
  undefined1 local_41a;
  bool local_419;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3dc [2];
  undefined1 local_3da;
  bool local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39c [2];
  undefined1 local_39a;
  bool local_399;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35c [2];
  undefined1 local_35a;
  bool local_359;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31c [2];
  undefined1 local_31a;
  bool local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2dc [2];
  undefined1 local_2da;
  bool local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29c [2];
  undefined1 local_29a;
  bool local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25c [2];
  undefined1 local_25a;
  bool local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21c [2];
  undefined1 local_21a;
  bool local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1dc [2];
  undefined1 local_1da;
  bool local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19c [2];
  undefined1 local_19a;
  bool local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15c [2];
  undefined1 local_15a;
  bool local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11c [2];
  undefined1 local_11a;
  bool local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_dc [2];
  undefined1 local_da;
  bool local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9c [2];
  undefined1 local_9a;
  bool local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [20];
  undefined1 local_4a;
  bool local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_48,0);
  local_49 = false;
  local_a[0] = trial::dynamic::operator<(&local_48,&local_49);
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1294,"void relational_suite::compare_integer_with_boolean_literal()",local_a,
             &local_4a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_98,0);
  local_99 = false;
  local_5e[0] = trial::dynamic::operator<=(&local_98,&local_99);
  local_9a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1295,"void relational_suite::compare_integer_with_boolean_literal()",local_5e,
             &local_9a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,0);
  local_d9 = false;
  local_9c[0] = trial::dynamic::operator>(&local_d8,&local_d9);
  local_da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1296,"void relational_suite::compare_integer_with_boolean_literal()",local_9c,
             &local_da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_118,0);
  local_119 = false;
  local_dc[0] = trial::dynamic::operator>=(&local_118,&local_119);
  local_11a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1297,"void relational_suite::compare_integer_with_boolean_literal()",local_dc,
             &local_11a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,0);
  local_159 = true;
  local_11c[0] = trial::dynamic::operator<(&local_158,&local_159);
  local_15a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1299,"void relational_suite::compare_integer_with_boolean_literal()",local_11c,
             &local_15a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_198,0);
  local_199 = true;
  local_15c[0] = trial::dynamic::operator<=(&local_198,&local_199);
  local_19a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x129a,"void relational_suite::compare_integer_with_boolean_literal()",local_15c,
             &local_19a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1d8,0);
  local_1d9 = true;
  local_19c[0] = trial::dynamic::operator>(&local_1d8,&local_1d9);
  local_1da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x129b,"void relational_suite::compare_integer_with_boolean_literal()",local_19c,
             &local_1da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_218,0);
  local_219 = true;
  local_1dc[0] = trial::dynamic::operator>=(&local_218,&local_219);
  local_21a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x129c,"void relational_suite::compare_integer_with_boolean_literal()",local_1dc,
             &local_21a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_258,1);
  local_259 = false;
  local_21c[0] = trial::dynamic::operator<(&local_258,&local_259);
  local_25a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x129e,"void relational_suite::compare_integer_with_boolean_literal()",local_21c,
             &local_25a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_298,1);
  local_299 = false;
  local_25c[0] = trial::dynamic::operator<=(&local_298,&local_299);
  local_29a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x129f,"void relational_suite::compare_integer_with_boolean_literal()",local_25c,
             &local_29a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2d8,1);
  local_2d9 = false;
  local_29c[0] = trial::dynamic::operator>(&local_2d8,&local_2d9);
  local_2da = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a0,"void relational_suite::compare_integer_with_boolean_literal()",local_29c,
             &local_2da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_318,1);
  local_319 = false;
  local_2dc[0] = trial::dynamic::operator>=(&local_318,&local_319);
  local_31a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a1,"void relational_suite::compare_integer_with_boolean_literal()",local_2dc,
             &local_31a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_358,1);
  local_359 = true;
  local_31c[0] = trial::dynamic::operator<(&local_358,&local_359);
  local_35a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a3,"void relational_suite::compare_integer_with_boolean_literal()",local_31c,
             &local_35a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_398,1);
  local_399 = true;
  local_35c[0] = trial::dynamic::operator<=(&local_398,&local_399);
  local_39a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a4,"void relational_suite::compare_integer_with_boolean_literal()",local_35c,
             &local_39a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3d8,1);
  local_3d9 = true;
  local_39c[0] = trial::dynamic::operator>(&local_3d8,&local_3d9);
  local_3da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a5,"void relational_suite::compare_integer_with_boolean_literal()",local_39c,
             &local_3da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_418,1);
  local_419 = true;
  local_3dc[0] = trial::dynamic::operator>=(&local_418,&local_419);
  local_41a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a6,"void relational_suite::compare_integer_with_boolean_literal()",local_3dc,
             &local_41a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_458,0);
  local_459 = false;
  local_41c[0] = trial::dynamic::operator<(&local_458,&local_459);
  local_45a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) < false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12a9,"void relational_suite::compare_integer_with_boolean_literal()",local_41c,
             &local_45a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_498,0);
  local_499 = false;
  local_45c[0] = trial::dynamic::operator<=(&local_498,&local_499);
  local_49a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) <= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12aa,"void relational_suite::compare_integer_with_boolean_literal()",local_45c,
             &local_49a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_4d8,0);
  local_4d9 = false;
  local_49c[0] = trial::dynamic::operator>(&local_4d8,&local_4d9);
  local_4da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) > false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12ab,"void relational_suite::compare_integer_with_boolean_literal()",local_49c,
             &local_4da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_518,0);
  local_519 = false;
  local_4dc[0] = trial::dynamic::operator>=(&local_518,&local_519);
  local_51a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) >= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12ac,"void relational_suite::compare_integer_with_boolean_literal()",local_4dc,
             &local_51a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_558,0);
  local_559 = true;
  local_51c[0] = trial::dynamic::operator<(&local_558,&local_559);
  local_55a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) < true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12ae,"void relational_suite::compare_integer_with_boolean_literal()",local_51c,
             &local_55a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_598,0);
  local_599 = true;
  local_55c[0] = trial::dynamic::operator<=(&local_598,&local_599);
  local_59a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) <= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12af,"void relational_suite::compare_integer_with_boolean_literal()",local_55c,
             &local_59a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_5d8,0);
  local_5d9 = true;
  local_59c[0] = trial::dynamic::operator>(&local_5d8,&local_5d9);
  local_5da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) > true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b0,"void relational_suite::compare_integer_with_boolean_literal()",local_59c,
             &local_5da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_618,0);
  local_619 = true;
  local_5dc[0] = trial::dynamic::operator>=(&local_618,&local_619);
  local_61a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) >= true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b1,"void relational_suite::compare_integer_with_boolean_literal()",local_5dc,
             &local_61a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_658,1);
  local_659 = false;
  local_61c[0] = trial::dynamic::operator<(&local_658,&local_659);
  local_65a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) < false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b3,"void relational_suite::compare_integer_with_boolean_literal()",local_61c,
             &local_65a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_698,1);
  local_699 = false;
  local_65c[0] = trial::dynamic::operator<=(&local_698,&local_699);
  local_69a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) <= false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b4,"void relational_suite::compare_integer_with_boolean_literal()",local_65c,
             &local_69a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_6d8,1);
  local_6d9 = false;
  local_69c[0] = trial::dynamic::operator>(&local_6d8,&local_6d9);
  local_6da = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) > false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b5,"void relational_suite::compare_integer_with_boolean_literal()",local_69c,
             &local_6da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_718,1);
  local_719 = false;
  local_6dc[0] = trial::dynamic::operator>=(&local_718,&local_719);
  local_71a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) >= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b6,"void relational_suite::compare_integer_with_boolean_literal()",local_6dc,
             &local_71a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_758,1);
  local_759 = true;
  local_71c[0] = trial::dynamic::operator<(&local_758,&local_759);
  local_75a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) < true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b8,"void relational_suite::compare_integer_with_boolean_literal()",local_71c,
             &local_75a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_798,1);
  local_799 = true;
  local_75c[0] = trial::dynamic::operator<=(&local_798,&local_799);
  local_79a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) <= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12b9,"void relational_suite::compare_integer_with_boolean_literal()",local_75c,
             &local_79a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_7d8,1);
  local_7d9 = true;
  local_79c[0] = trial::dynamic::operator>(&local_7d8,&local_7d9);
  local_7da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) > true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12ba,"void relational_suite::compare_integer_with_boolean_literal()",local_79c,
             &local_7da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_818,1);
  local_819 = true;
  local_7dc[0] = trial::dynamic::operator>=(&local_818,&local_819);
  local_81a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) >= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x12bb,"void relational_suite::compare_integer_with_boolean_literal()",local_7dc,
             &local_81a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  return;
}

Assistant:

void compare_integer_with_boolean_literal()
{
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= false, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= false, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < true, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= true, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > true, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= true, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > false, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= false, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < true, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= true, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > true, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= true, true);
    }
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) < false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) <= false, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) > false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) >= false, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) < true, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) <= true, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) > true, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) >= true, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) < false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) <= false, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) > false, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) >= false, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) < true, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) <= true, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) > true, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) >= true, true);
    }
}